

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::WindowExpression::Copy(WindowExpression *this)

{
  WindowBoundary WVar1;
  WindowExcludeMode WVar2;
  bool bVar3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar4;
  OrderType *pOVar5;
  _func_int **pp_Var6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  pointer pWVar9;
  pointer pPVar10;
  pointer *__ptr;
  ParsedExpression *in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar11
  ;
  OrderType *__args;
  _func_int **__args_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::WindowExpression_*,_false> local_40;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_38
  ;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)this;
  make_uniq<duckdb::WindowExpression,duckdb::ExpressionType_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((duckdb *)&local_40,&(in_RSI->super_BaseExpression).type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RSI[1].super_BaseExpression.alias.field_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RSI[2].super_BaseExpression.type);
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  ParsedExpression::CopyProperties(&pWVar9->super_ParsedExpression,in_RSI);
  puVar4 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)in_RSI[2].super_BaseExpression.query_location.index;
  for (puVar11 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   **)((long)&in_RSI[2].super_BaseExpression.alias.field_2 + 8); puVar11 != puVar4;
      puVar11 = puVar11 + 1) {
    pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_40);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(puVar11);
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pWVar9->children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48);
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  puVar4 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)in_RSI[3].super_BaseExpression.alias._M_dataplus._M_p;
  for (puVar11 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   **)&in_RSI[3].super_BaseExpression.type; puVar11 != puVar4; puVar11 = puVar11 + 1
      ) {
    pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_40);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(puVar11);
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pWVar9->partitions,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48);
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  pOVar5 = *(OrderType **)((long)&in_RSI[3].super_BaseExpression.alias.field_2 + 8);
  for (__args = (OrderType *)in_RSI[3].super_BaseExpression.alias.field_2._M_allocated_capacity;
      __args != pOVar5; __args = __args + 0x10) {
    pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_40);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)(__args + 8));
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
    ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
    emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)&pWVar9->orders,
               __args,__args + 1,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48);
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  pp_Var6 = in_RSI[5].super_BaseExpression._vptr_BaseExpression;
  for (__args_00 = (_func_int **)in_RSI[4].super_BaseExpression.query_location.index;
      __args_00 != pp_Var6; __args_00 = __args_00 + 2) {
    pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_40);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)(__args_00 + 1));
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
    ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
    emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)
               &pWVar9->arg_orders,(OrderType *)__args_00,(OrderByNullType *)((long)__args_00 + 1),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48);
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (in_RSI[4].super_BaseExpression._vptr_BaseExpression == (_func_int **)0x0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)(in_RSI + 4));
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
  }
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  _Var8._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var7._M_head_impl =
       (pWVar9->filter_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar9->filter_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  WVar1 = in_RSI[4].super_BaseExpression.field_0xa;
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  pWVar9->start = WVar1;
  WVar1 = in_RSI[4].super_BaseExpression.field_0xb;
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  pWVar9->end = WVar1;
  WVar2 = in_RSI[4].super_BaseExpression.field_0xc;
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  pWVar9->exclude_clause = WVar2;
  if (in_RSI[4].super_BaseExpression.alias._M_dataplus._M_p == (pointer)0x0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&in_RSI[4].super_BaseExpression.alias);
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
  }
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  _Var8._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var7._M_head_impl =
       (pWVar9->start_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar9->start_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (in_RSI[4].super_BaseExpression.alias._M_string_length == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&in_RSI[4].super_BaseExpression.alias._M_string_length);
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
  }
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  _Var8._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var7._M_head_impl =
       (pWVar9->end_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar9->end_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (in_RSI[4].super_BaseExpression.alias.field_2._M_allocated_capacity == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&in_RSI[4].super_BaseExpression.alias.field_2._M_allocated_capacity);
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
  }
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  _Var8._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var7._M_head_impl =
       (pWVar9->offset_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar9->offset_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (*(long *)((long)&in_RSI[4].super_BaseExpression.alias.field_2 + 8) == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)((long)&in_RSI[4].super_BaseExpression.alias.field_2 + 8));
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar10);
  }
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  _Var8._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var7._M_head_impl =
       (pWVar9->default_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar9->default_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  bVar3 = (bool)in_RSI[4].super_BaseExpression.type;
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  pWVar9->ignore_nulls = bVar3;
  bVar3 = (bool)in_RSI[4].super_BaseExpression.expression_class;
  pWVar9 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_40);
  pWVar9->distinct = bVar3;
  *(WindowExpression **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = local_40._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_38._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> WindowExpression::Copy() const {
	auto new_window = make_uniq<WindowExpression>(type, catalog, schema, function_name);
	new_window->CopyProperties(*this);

	for (auto &child : children) {
		new_window->children.push_back(child->Copy());
	}

	for (auto &e : partitions) {
		new_window->partitions.push_back(e->Copy());
	}

	for (auto &o : orders) {
		new_window->orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	for (auto &o : arg_orders) {
		new_window->arg_orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	new_window->filter_expr = filter_expr ? filter_expr->Copy() : nullptr;

	new_window->start = start;
	new_window->end = end;
	new_window->exclude_clause = exclude_clause;
	new_window->start_expr = start_expr ? start_expr->Copy() : nullptr;
	new_window->end_expr = end_expr ? end_expr->Copy() : nullptr;
	new_window->offset_expr = offset_expr ? offset_expr->Copy() : nullptr;
	new_window->default_expr = default_expr ? default_expr->Copy() : nullptr;
	new_window->ignore_nulls = ignore_nulls;
	new_window->distinct = distinct;

	return std::move(new_window);
}